

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

HelicsFederateState helicsFederateGetState(HelicsFederate fed,HelicsError *err)

{
  Modes mode;
  Federate *pFVar1;
  HelicsError *in_RSI;
  HelicsFederate in_RDI;
  Modes fedMode;
  Federate *fedObj;
  undefined4 local_4;
  
  pFVar1 = getFed(in_RDI,in_RSI);
  if (pFVar1 == (Federate *)0x0) {
    local_4 = HELICS_STATE_UNKNOWN;
  }
  else {
    mode = helics::Federate::getCurrentMode((Federate *)0x1bcbce);
    local_4 = anon_unknown.dwarf_4e9a2::stateConversion(mode);
  }
  return local_4;
}

Assistant:

HelicsFederateState helicsFederateGetState(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_STATE_UNKNOWN;
    }

    auto fedMode = fedObj->getCurrentMode();
    return stateConversion(fedMode);
}